

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

put_transaction<density_tests::MultipleDerived> * __thiscall
density::
heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
::start_emplace<density_tests::MultipleDerived>
          (put_transaction<density_tests::MultipleDerived> *__return_storage_ptr__,
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
          *this)

{
  MultipleDerived *this_00;
  Allocation AVar1;
  put_transaction<density_tests::MultipleDerived> local_38;
  
  AVar1 = heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
          ::inplace_allocate<0ul,true,96ul,16ul>
                    ((heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>
                      *)this);
  this_00 = (MultipleDerived *)AVar1.m_user_storage;
  AVar1.m_control_block[1].m_next =
       (uintptr_t)
       detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::MultipleDerived>
       ::s_table;
  *(undefined8 *)&this_00->field_0x50 = 0;
  *(undefined8 *)&this_00->field_0x58 = 0;
  *(undefined8 *)&this_00->field_0x40 = 0;
  *(undefined8 *)&this_00->field_0x48 = 0;
  *(undefined8 *)&(this_00->super_Derived1).field_0x30 = 0;
  *(undefined8 *)&(this_00->super_Derived1).field_0x38 = 0;
  *(undefined8 *)&(this_00->super_Derived1).field_0x20 = 0;
  *(undefined8 *)&(this_00->super_Derived1).field_0x28 = 0;
  *(undefined8 *)&(this_00->super_Derived1).field_0x10 = 0;
  *(undefined8 *)&(this_00->super_Derived1).field_0x18 = 0;
  (this_00->super_Derived1)._vptr_Derived1 = (_func_int **)0x0;
  (this_00->super_Derived1).m_int64 = 0;
  density_tests::MultipleDerived::MultipleDerived(this_00);
  __return_storage_ptr__->m_queue = this;
  __return_storage_ptr__->m_put_data = AVar1;
  local_38.m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  local_38.m_put_data = AVar1;
  put_transaction<density_tests::MultipleDerived>::~put_transaction(&local_38);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              0,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  0);
                push_data.m_control_block->m_next += detail::Queue_Dead;
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }